

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

lword entry_address(GlobalVars *gv)

{
  int iVar1;
  lword in_RAX;
  Symbol *pSVar2;
  ushort **ppuVar3;
  LinkedSection *pLVar4;
  lword entry;
  
  entry = in_RAX;
  if (gv->entry_name != (char *)0x0) {
    entry = 0;
    pSVar2 = findsymbol(gv,(Section *)0x0,gv->entry_name);
    if (pSVar2 != (Symbol *)0x0) goto LAB_00110bef;
    ppuVar3 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar3 + (ulong)(byte)*gv->entry_name * 2 + 1) & 8) != 0) &&
       (iVar1 = __isoc99_sscanf(gv->entry_name,"%lli",&entry), iVar1 == 1)) {
      return entry;
    }
  }
  pSVar2 = findsymbol(gv,(Section *)0x0,"_start");
  if (pSVar2 == (Symbol *)0x0) {
    pLVar4 = find_lnksec(gv,(char *)0x0,'\x01','\x01','\x03','\x05');
    if (pLVar4 == (LinkedSection *)0x0) {
      return 0;
    }
    return pLVar4->base;
  }
LAB_00110bef:
  return pSVar2->value;
}

Assistant:

lword entry_address(struct GlobalVars *gv)
/* returns address of entry point for executables */
{
  struct Symbol *sym;
  struct LinkedSection *ls;

  if (gv->entry_name) {
    lword entry = 0;

    if (sym = findsymbol(gv,NULL,gv->entry_name)) {
      return (lword)sym->value;
    }
    else if (isdigit((unsigned char)*gv->entry_name)) {
      if (sscanf(gv->entry_name,"%lli",&entry) == 1)
        return entry;
    }
  }

  /* plan b: search for _start symbol: */
  if (sym = findsymbol(gv,NULL,"_start"))
      return (lword)sym->value;

  /* plan c: search for first executable section */
  if (ls = find_lnksec(gv,NULL,ST_CODE,SF_ALLOC,SF_ALLOC|SF_UNINITIALIZED,
                       SP_READ|SP_EXEC))
    return (lword)ls->base;

  return 0;
}